

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTestListener.cpp
# Opt level: O1

void __thiscall
rc::detail::LogTestListener::onTestCaseFinished(LogTestListener *this,CaseDescription *description)

{
  Type TVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if (this->m_verboseProgress != true) {
    return;
  }
  TVar1 = (description->result).type;
  if (TVar1 == Discard) {
    poVar3 = this->m_out;
    pcVar4 = "x";
  }
  else {
    if (TVar1 == Failure) {
      cVar2 = (char)this->m_out;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->m_out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Found failure, shrinking",0x18);
      poVar3 = this->m_out;
      pcVar4 = "...";
      if (this->m_verboseShrinking != false) {
        pcVar4 = ":";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pcVar4,(ulong)(this->m_verboseShrinking ^ 1) * 2 + 1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return;
    }
    if (TVar1 != Success) {
      return;
    }
    poVar3 = this->m_out;
    pcVar4 = ".";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,1);
  return;
}

Assistant:

void LogTestListener::onTestCaseFinished(const CaseDescription &description) {
  if (!m_verboseProgress) {
    return;
  }

  switch (description.result.type) {
  case CaseResult::Type::Success:
    m_out << ".";
    break;
  case CaseResult::Type::Discard:
    m_out << "x";
    break;
  case CaseResult::Type::Failure:
    m_out << std::endl << "Found failure, shrinking";
    m_out << (m_verboseShrinking ? ":" : "...") << std::endl;
    break;
  }
}